

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGhsMultiGenerator::GetTargetDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalGhsMultiGenerator *this,cmGeneratorTarget *target)

{
  string *str;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  undefined1 local_21;
  cmGeneratorTarget *local_20;
  cmGeneratorTarget *target_local;
  cmLocalGhsMultiGenerator *this_local;
  string *dir;
  
  local_21 = 0;
  local_20 = target;
  target_local = (cmGeneratorTarget *)this;
  this_local = (cmLocalGhsMultiGenerator *)__return_storage_ptr__;
  str = cmGeneratorTarget::GetName_abi_cxx11_(target);
  cmAlphaNum::cmAlphaNum(&local_58,str);
  cmAlphaNum::cmAlphaNum(&local_88,".dir");
  cmStrCat<>(__return_storage_ptr__,&local_58,&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGhsMultiGenerator::GetTargetDirectory(
  cmGeneratorTarget const* target) const
{
  std::string dir = cmStrCat(target->GetName(), ".dir");
  return dir;
}